

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

bool absl::lts_20250127::base_internal::LowLevelAlloc::DeleteArena(Arena *arena)

{
  int iVar1;
  size_t length;
  AllocList *start;
  int iVar2;
  uint *puVar3;
  ArenaLock section;
  
  if (arena != (Arena *)0x0) {
    DefaultArena();
    if (arena != (Arena *)(anonymous_namespace)::default_arena_storage) {
      anon_unknown_0::UnhookedArena();
      if (arena != (Arena *)(anonymous_namespace)::unhooked_arena_storage) {
        anon_unknown_0::ArenaLock::ArenaLock(&section,arena);
        iVar1 = arena->allocation_count;
        if (iVar1 == 0) {
          while (start = (arena->freelist).next[0], start != (AllocList *)0x0) {
            length = (start->header).size;
            (arena->freelist).next[0] = start->next[0];
            if (((start->header).magic ^ (ulong)start) != 0xffffffffb37cc16a) {
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x18d,"Check %s failed: %s",
                         "region->header.magic == Magic(kMagicUnallocated, &region->header)",
                         "bad magic number in DeleteArena()");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                            ,0x18d,
                            "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
            }
            if ((start->header).arena != arena) {
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",399,"Check %s failed: %s",
                         "region->header.arena == arena","bad arena pointer in DeleteArena()");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                            ,399,
                            "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
            }
            if (length % arena->pagesize != 0) {
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x191,"Check %s failed: %s",
                         "size % arena->pagesize == 0","empty arena has non-page-aligned block size"
                        );
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                            ,0x191,
                            "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
            }
            if ((ulong)start % arena->pagesize != 0) {
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x193,"Check %s failed: %s",
                         "reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0",
                         "empty arena has non-page-aligned block");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                            ,0x193,
                            "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
            }
            if ((arena->flags & 2) == 0) {
              iVar2 = munmap(start,length);
            }
            else {
              iVar2 = DirectMunmap(start,length);
            }
            if (iVar2 != 0) {
              puVar3 = (uint *)__errno_location();
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1a5,
                         "LowLevelAlloc::DeleteArena: munmap failed: %d",(ulong)*puVar3);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                            ,0x1a5,
                            "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
            }
          }
          anon_unknown_0::ArenaLock::Leave(&section);
          Free(arena);
        }
        else {
          anon_unknown_0::ArenaLock::Leave(&section);
        }
        anon_unknown_0::ArenaLock::~ArenaLock(&section);
        return iVar1 == 0;
      }
    }
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x181,"Check %s failed: %s",
             "arena != nullptr && arena != DefaultArena() && arena != UnhookedArena()",
             "may not delete default arena");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x181,"static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
}

Assistant:

bool LowLevelAlloc::DeleteArena(Arena *arena) {
  ABSL_RAW_CHECK(
      arena != nullptr && arena != DefaultArena() && arena != UnhookedArena(),
      "may not delete default arena");
  ArenaLock section(arena);
  if (arena->allocation_count != 0) {
    section.Leave();
    return false;
  }
  while (arena->freelist.next[0] != nullptr) {
    AllocList *region = arena->freelist.next[0];
    size_t size = region->header.size;
    arena->freelist.next[0] = region->next[0];
    ABSL_RAW_CHECK(
        region->header.magic == Magic(kMagicUnallocated, &region->header),
        "bad magic number in DeleteArena()");
    ABSL_RAW_CHECK(region->header.arena == arena,
                   "bad arena pointer in DeleteArena()");
    ABSL_RAW_CHECK(size % arena->pagesize == 0,
                   "empty arena has non-page-aligned block size");
    ABSL_RAW_CHECK(reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0,
                   "empty arena has non-page-aligned block");
    int munmap_result;
#ifdef _WIN32
    munmap_result = VirtualFree(region, 0, MEM_RELEASE);
    ABSL_RAW_CHECK(munmap_result != 0,
                   "LowLevelAlloc::DeleteArena: VitualFree failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) == 0) {
      munmap_result = munmap(region, size);
    } else {
      munmap_result = base_internal::DirectMunmap(region, size);
    }
#else
    munmap_result = munmap(region, size);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (munmap_result != 0) {
      ABSL_RAW_LOG(FATAL, "LowLevelAlloc::DeleteArena: munmap failed: %d",
                   errno);
    }
#endif  // _WIN32
  }
  section.Leave();
  arena->~Arena();
  Free(arena);
  return true;
}